

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O0

enable_if_t<IsFabArray<MultiFab>::value>
amrex::(anonymous_namespace)::
FillPatchTwoLevels_doit<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
          (MultiFab *mf,IntVect *nghost,Real time,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *cmf,
          Vector<double,_std::allocator<double>_> *ct,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *fmf,
          Vector<double,_std::allocator<double>_> *ft,int scomp,int dcomp,int ncomp,Geometry *cgeom,
          Geometry *fgeom,StateDataPhysBCFunct *cbc,int cbccomp,StateDataPhysBCFunct *fbc,
          int fbccomp,IntVect *ratio,InterpBase *mapper,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcscomp,
          NullInterpHook<amrex::FArrayBox> *pre_interp,NullInterpHook<amrex::FArrayBox> *post_interp
          ,IndexSpace *index_space)

{
  undefined8 uVar1;
  undefined8 uVar2;
  IntVect ratio_00;
  IntVect ratio_01;
  bool bVar3;
  uint uVar4;
  MultiFab **ppMVar5;
  DistributionMapping *pDVar6;
  FPinfo *fpc_00;
  BaseFab<double> *pBVar7;
  Box *pBVar8;
  CPC *this;
  byte bVar9;
  uint uVar10;
  IntVect *in_RSI;
  FabArray<amrex::FArrayBox> *in_RDI;
  undefined8 in_R8;
  Periodicity PVar11;
  int in_stack_00000018;
  FabArrayBase *in_stack_00000020;
  FabArray<amrex::FArrayBox> *in_stack_00000028;
  FabArray<amrex::FArrayBox> *in_stack_00000030;
  FabArray<amrex::FArrayBox> *in_stack_00000040;
  MFIter *in_stack_00000050;
  long in_stack_00000058;
  FabArrayBase *in_stack_00000060;
  undefined4 in_stack_00000068;
  NullInterpHook<amrex::FArrayBox> *in_stack_00000070;
  NullInterpHook<amrex::FArrayBox> *in_stack_00000078;
  Geometry *in_stack_00000080;
  Box *dbx;
  FArrayBox *dfab_1;
  MFIter mfi_3;
  Box bx;
  Box result;
  Box *sbx;
  FArrayBox *sfab_1;
  MFIter mfi_2;
  MultiFab mf_fine_patch;
  MultiFab mf_crse_patch_1;
  FPinfo *fpc_1;
  MultiFab **fmf_a;
  const_iterator __end0;
  const_iterator __begin0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *__range5;
  bool aliasing;
  FAB *dfab;
  MFIter mfi_1;
  FAB *sfab;
  MFIter mfi;
  CPC mask_cpc;
  MultiFab mf_solution;
  MultiFab mf_known;
  iMultiFab solve_mask;
  MultiFab mf_refined_patch;
  MultiFab mf_crse_patch;
  FPinfo *fpc;
  MultiFab fmf_cc_dummy;
  MultiFab mf_cc_dummy;
  InterpolaterBoxCoarsener *coarsener;
  int off;
  uint bitval;
  uint typ;
  int dir;
  int r;
  FabArrayBase *in_stack_ffffffffffffe6c8;
  undefined8 *puVar12;
  MFIter *mfi_00;
  FabArrayBase *pFVar13;
  BoxArray *in_stack_ffffffffffffe6d0;
  FabArray<amrex::FArrayBox> *pFVar14;
  BDKey *in_stack_ffffffffffffe6d8;
  FabArrayBase *in_stack_ffffffffffffe6e0;
  BoxArray *in_stack_ffffffffffffe6e8;
  MFInfo *in_stack_ffffffffffffe6f0;
  IntVect *snghost;
  uchar flags_;
  FabArrayBase *in_stack_ffffffffffffe6f8;
  undefined4 uVar15;
  FabArrayBase *fabarray_;
  Geometry *in_stack_ffffffffffffe700;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe708;
  undefined4 in_stack_ffffffffffffe710;
  undefined4 in_stack_ffffffffffffe714;
  undefined4 uVar16;
  int in_stack_ffffffffffffe718;
  int in_stack_ffffffffffffe71c;
  FabArray<amrex::IArrayBox> *in_stack_ffffffffffffe720;
  MultiFab *in_stack_ffffffffffffe728;
  Box *this_00;
  MultiFab *in_stack_ffffffffffffe730;
  undefined4 in_stack_ffffffffffffe738;
  undefined4 in_stack_ffffffffffffe73c;
  int iVar17;
  CpOp CVar18;
  Geometry *in_stack_ffffffffffffe740;
  FPinfo *in_stack_ffffffffffffe748;
  IntVect *in_stack_ffffffffffffe750;
  FabArrayBase *in_stack_ffffffffffffe758;
  CPC *in_stack_ffffffffffffe760;
  Geometry *in_stack_ffffffffffffe770;
  undefined4 in_stack_ffffffffffffe778;
  undefined4 in_stack_ffffffffffffe77c;
  undefined4 in_stack_ffffffffffffe780;
  undefined4 in_stack_ffffffffffffe784;
  Geometry *in_stack_ffffffffffffe788;
  InterpBase *in_stack_ffffffffffffe790;
  RunOn gpu_or_cpu;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_ffffffffffffe798;
  int in_stack_ffffffffffffe7a0;
  undefined4 in_stack_ffffffffffffe7a4;
  int in_stack_ffffffffffffe7ac;
  FPinfo *in_stack_ffffffffffffe7b0;
  IndexType in_stack_ffffffffffffe7bc;
  undefined8 in_stack_ffffffffffffe820;
  FPinfo *in_stack_ffffffffffffe828;
  undefined8 in_stack_ffffffffffffe840;
  int iVar19;
  IndexType IVar20;
  undefined4 in_stack_ffffffffffffe850;
  undefined4 in_stack_ffffffffffffe854;
  Geometry *in_stack_ffffffffffffe858;
  undefined4 in_stack_ffffffffffffe860;
  undefined4 in_stack_ffffffffffffe864;
  IntVect *in_stack_ffffffffffffe868;
  undefined4 in_stack_ffffffffffffe870;
  undefined4 in_stack_ffffffffffffe874;
  int ncomp_00;
  FabArrayBase *in_stack_ffffffffffffe878;
  long local_1700;
  bool local_16d9;
  int local_16d8;
  int local_16d4;
  IntVect local_16c4;
  Box *local_16b8;
  BaseFab<double> *local_16b0;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_ffffffffffffe9a0;
  uint local_1648;
  int local_1644 [2];
  undefined8 uStack_163c;
  undefined8 local_1634;
  undefined1 local_162c [12];
  undefined1 auStack_1620 [56];
  MFIter local_15e8 [8];
  int in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  Vector<double,_std::allocator<double>_> *in_stack_ffffffffffffed20;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_ffffffffffffed28;
  Real in_stack_ffffffffffffed30;
  IntVect *in_stack_ffffffffffffed38;
  MultiFab *in_stack_ffffffffffffed40;
  IntVect local_1280;
  IntVect local_1274;
  reference local_1268;
  MultiFab **local_1260;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  local_1258;
  undefined8 local_1250;
  byte local_1241;
  BaseFab<double> *local_1240;
  MFIter local_1238;
  BaseFab<double> *local_11d8;
  MFIter local_11d0;
  IntVect local_1170;
  undefined8 local_1160;
  int local_1158;
  int local_1150 [2];
  int local_1148;
  int local_1140 [2];
  int local_1138;
  int local_1130 [2];
  int local_1128;
  int local_1120 [2];
  int local_1118;
  undefined8 local_fd0;
  MFInfo local_fc8 [5];
  int in_stack_fffffffffffff120;
  Geometry *in_stack_fffffffffffff128;
  StateDataPhysBCFunct *in_stack_fffffffffffff130;
  int in_stack_fffffffffffff138;
  MFInfo local_da8 [13];
  FabArrayBase *local_b90;
  undefined4 local_b88;
  FabArrayBase *local_b80;
  undefined4 local_b78;
  uint local_b74;
  FabArray<amrex::FArrayBox> local_b70;
  FabArrayBase *local_9f0;
  undefined4 local_9e8;
  FabArrayBase *local_9e0;
  undefined4 local_9d8;
  uint local_9d4;
  FabArrayBase local_9d0;
  uint local_84c;
  FPinfo *local_6c8;
  undefined8 local_6c0;
  MFInfo local_6b8;
  int local_688 [2];
  int local_680;
  int local_678 [2];
  int local_670;
  undefined8 local_480;
  MFInfo local_478;
  int local_448 [2];
  int local_440;
  int local_438 [2];
  int local_430;
  uint local_22c;
  uint local_228;
  uint local_224;
  undefined1 local_220 [32];
  undefined1 *local_200;
  BDKey local_1f8;
  BDKey local_1e8;
  undefined8 local_1d0;
  IntVect *local_1b0;
  FabArray<amrex::FArrayBox> *local_1a8;
  char *local_1a0;
  uint local_194;
  uint *local_190;
  Box *local_188;
  int local_180;
  uint local_17c;
  uint local_178;
  int local_174;
  int *local_170;
  uint local_168;
  int local_164;
  undefined1 *local_160;
  int local_154;
  uint *local_150;
  int local_144;
  uint *local_140;
  int local_134;
  undefined1 *local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  long local_118;
  uint local_110;
  int local_10c;
  MultiFab *local_108;
  int local_fc;
  MultiFab *local_f8;
  int local_f0;
  int local_ec;
  MultiFab *local_e8;
  int local_dc;
  int local_d8 [2];
  int local_d0;
  IntVect local_c4;
  int local_b8 [2];
  int local_b0;
  IntVect local_a4;
  int local_98 [2];
  int local_90;
  IntVect local_84;
  int local_78 [2];
  int local_70;
  IntVect local_68;
  int local_5c;
  undefined4 local_4c;
  uint *local_48;
  undefined4 local_40;
  undefined4 local_3c;
  uint *local_38;
  undefined4 local_30;
  undefined4 local_2c;
  uint *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  int *local_10;
  
  iVar17 = (int)((ulong)in_stack_ffffffffffffe820 >> 0x20);
  if (in_RSI->vect[1] < in_RSI->vect[0]) {
    local_16d4 = in_RSI->vect[0];
  }
  else {
    local_16d4 = in_RSI->vect[1];
  }
  local_5c = local_16d4;
  if (in_RSI->vect[2] < local_16d4) {
    local_16d8 = local_16d4;
  }
  else {
    local_16d8 = in_RSI->vect[2];
  }
  local_16d9 = true;
  uVar1 = uStack_163c;
  uVar2 = local_1634;
  local_1d0 = in_R8;
  local_1b0 = in_RSI;
  local_1a8 = in_RDI;
  if (local_16d8 < 1) {
    local_1e8 = FabArrayBase::getBDKey(in_stack_ffffffffffffe6e0);
    uVar2 = local_1634;
    uVar1 = uStack_163c;
    Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_ffffffffffffe6d0,(size_type)in_stack_ffffffffffffe6c8);
    local_1634 = uVar2;
    uStack_163c = uVar1;
    uVar2 = local_1634;
    uVar1 = uStack_163c;
    local_1f8 = FabArrayBase::getBDKey(in_stack_ffffffffffffe6e0);
    local_1634 = uVar2;
    uStack_163c = uVar1;
    uVar2 = local_1634;
    uVar1 = uStack_163c;
    local_16d9 = FabArrayBase::BDKey::operator!=
                           ((BDKey *)in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8);
    local_1634 = uVar2;
    uStack_163c = uVar1;
    uVar2 = local_1634;
    uVar1 = uStack_163c;
  }
  local_1634 = uVar2;
  uStack_163c = uVar1;
  uVar15 = local_1634._4_4_;
  uVar4 = uStack_163c._4_4_;
  uVar1 = uStack_163c;
  uVar2 = local_1634;
  if (local_16d9 != false) {
    uStack_163c._4_4_ = uVar4;
    local_1634._4_4_ = uVar15;
    InterpBase::BoxCoarsener
              ((InterpBase *)in_stack_ffffffffffffe6d8,(IntVect *)in_stack_ffffffffffffe6d0);
    uVar2 = local_1634;
    uVar1 = uStack_163c;
    local_200 = local_220;
    local_224 = (uint)FabArrayBase::ixType(in_stack_ffffffffffffe6c8);
    local_1634 = uVar2;
    uStack_163c = uVar1;
    uVar2 = local_1634;
    uVar1 = uStack_163c;
    local_28 = &local_224;
    local_2c = 0;
    local_1c = 0;
    uVar4 = local_224 & 1;
    local_228 = (uint)FabArrayBase::ixType(in_stack_ffffffffffffe6c8);
    local_1634 = uVar2;
    uStack_163c = uVar1;
    uVar2 = local_1634;
    uVar1 = uStack_163c;
    local_38 = &local_228;
    local_3c = 1;
    local_30 = 1;
    uVar10 = local_228 & 2;
    local_22c = (uint)FabArrayBase::ixType(in_stack_ffffffffffffe6c8);
    local_1634 = uVar2;
    uStack_163c = uVar1;
    uVar2 = local_1634;
    uVar1 = uStack_163c;
    local_48 = &local_22c;
    local_4c = 2;
    local_40 = 2;
    if ((char)((uVar4 != 0) + (uVar10 != 0) + ((local_22c & 4) != 0)) == '\x01') {
      if (in_stack_00000058 == 0) {
        local_1700 = 0;
      }
      else {
        local_1700 = __dynamic_cast(in_stack_00000058,&InterpBase::typeinfo,&Interpolater::typeinfo,
                                    0);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar15 = local_1634._4_4_;
        uVar4 = uStack_163c._4_4_;
        uVar1 = uStack_163c;
        uVar2 = local_1634;
        uStack_163c._4_4_ = uVar4;
        local_1634._4_4_ = uVar15;
      }
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar15 = local_1634._4_4_;
      uVar4 = uStack_163c._4_4_;
      if (local_1700 == 0) {
        local_1a0 = "This interpolater has not yet implemented a version for face-based data";
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        Abort_host((char *)in_stack_ffffffffffffe6e0);
        uVar15 = local_1634._4_4_;
        uVar4 = uStack_163c._4_4_;
      }
      local_1634._4_4_ = uVar15;
      uStack_163c._4_4_ = uVar4;
      uVar15 = local_1634._4_4_;
      uVar4 = uStack_163c._4_4_;
      uVar1 = uStack_163c;
      uStack_163c._4_4_ = uVar4;
      uVar2 = local_1634;
      local_1634._4_4_ = uVar15;
      FabArrayBase::boxArray(&local_1a8->super_FabArrayBase);
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      IntVect::IntVect(&local_68,0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      local_70 = local_68.vect[2];
      local_78[0] = local_68.vect[0];
      local_78[1] = local_68.vect[1];
      local_440 = local_68.vect[2];
      local_448[0] = local_68.vect[0];
      local_448[1] = local_68.vect[1];
      local_430 = local_68.vect[2];
      local_438[0] = local_68.vect[0];
      local_438[1] = local_68.vect[1];
      convert(in_stack_ffffffffffffe6e8,(IntVect *)in_stack_ffffffffffffe6e0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      FabArrayBase::DistributionMap(&local_1a8->super_FabArrayBase);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      local_478.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_478.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_478.alloc = false;
      local_478._1_7_ = 0;
      local_478.arena = (Arena *)0x0;
      local_478.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MFInfo::MFInfo((MFInfo *)0x13a075a);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      MFInfo::SetAlloc(&local_478,false);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      local_480 = 0;
      puVar12 = &local_480;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe6d0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      MultiFab::MultiFab((MultiFab *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
                         (BoxArray *)in_stack_ffffffffffffe708,
                         (DistributionMapping *)in_stack_ffffffffffffe700,
                         (int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                         (IntVect *)in_stack_ffffffffffffe6f0,(MFInfo *)in_stack_ffffffffffffe6e8,
                         (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe720);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x13a07e3);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      MFInfo::~MFInfo((MFInfo *)0x13a07f0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      BoxArray::~BoxArray(in_stack_ffffffffffffe6d0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                          ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                           in_stack_ffffffffffffe6d0,(size_type)puVar12);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      FabArrayBase::boxArray((FabArrayBase *)*ppMVar5);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      IntVect::IntVect(&local_84,0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      local_90 = local_84.vect[2];
      local_98[0] = local_84.vect[0];
      local_98[1] = local_84.vect[1];
      local_680 = local_84.vect[2];
      local_688[0] = local_84.vect[0];
      local_688[1] = local_84.vect[1];
      local_670 = local_84.vect[2];
      local_678[0] = local_84.vect[0];
      local_678[1] = local_84.vect[1];
      convert(in_stack_ffffffffffffe6e8,(IntVect *)in_stack_ffffffffffffe6e0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                          ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                           in_stack_ffffffffffffe6d0,(size_type)puVar12);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      pDVar6 = FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar5);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      iVar19 = (int)pDVar6;
      IVar20.itype = (uint)((ulong)pDVar6 >> 0x20);
      local_6b8.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_6b8.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_6b8.alloc = false;
      local_6b8._1_7_ = 0;
      local_6b8.arena = (Arena *)0x0;
      local_6b8.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MFInfo::MFInfo((MFInfo *)0x13a092c);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      MFInfo::SetAlloc(&local_6b8,false);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      local_6c0 = 0;
      puVar12 = &local_6c0;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe6d0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      MultiFab::MultiFab((MultiFab *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
                         (BoxArray *)in_stack_ffffffffffffe708,
                         (DistributionMapping *)in_stack_ffffffffffffe700,
                         (int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                         (IntVect *)in_stack_ffffffffffffe6f0,(MFInfo *)in_stack_ffffffffffffe6e8,
                         (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe720);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x13a09ba);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      MFInfo::~MFInfo((MFInfo *)0x13a09c7);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      BoxArray::~BoxArray(in_stack_ffffffffffffe6d0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      fpc_00 = FabArrayBase::TheFPinfo
                         (in_stack_ffffffffffffe878,
                          (FabArrayBase *)
                          CONCAT44(in_stack_ffffffffffffe874,in_stack_ffffffffffffe870),
                          in_stack_ffffffffffffe868,
                          (BoxConverter *)
                          CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
                          in_stack_ffffffffffffe858,
                          (Geometry *)CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
                          (IndexSpace *)in_stack_ffffffffffffe9a0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      local_6c8 = fpc_00;
      bVar3 = BoxArray::empty((BoxArray *)0x13a0a3e);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      if (!bVar3) {
        ncomp_00 = in_stack_00000018;
        FabArrayBase::boxArray(&local_1a8->super_FabArrayBase);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_84c = (uint)BoxArray::ixType((BoxArray *)in_stack_00000080);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        anon_unknown_137::make_mf_crse_patch<amrex::MultiFab,_0>
                  (in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7ac,in_stack_ffffffffffffe7bc);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        FabArrayBase::boxArray(&local_1a8->super_FabArrayBase);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_9d4 = (uint)BoxArray::ixType((BoxArray *)in_stack_00000080);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_9e8 = *(undefined4 *)&in_stack_00000050->fabArray;
        local_9f0 = (in_stack_00000050->m_fa)._M_t.
                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        ratio_01.vect[2] = iVar19;
        ratio_01.vect._0_8_ = puVar12;
        local_9e0 = local_9f0;
        local_9d8 = local_9e8;
        anon_unknown_137::make_mf_refined_patch<amrex::MultiFab,_0>(fpc_00,ncomp_00,IVar20,ratio_01)
        ;
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        iVar19 = (int)local_6c8;
        IVar20.itype = (uint)((ulong)local_6c8 >> 0x20);
        FabArrayBase::boxArray(&local_1a8->super_FabArrayBase);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_b74 = (uint)BoxArray::ixType((BoxArray *)in_stack_00000080);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_b88 = *(undefined4 *)&in_stack_00000050->fabArray;
        local_b90 = (in_stack_00000050->m_fa)._M_t.
                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        ratio_00.vect[2] = iVar19;
        ratio_00.vect[0] = (int)in_stack_ffffffffffffe840;
        ratio_00.vect[1] = (int)((ulong)in_stack_ffffffffffffe840 >> 0x20);
        local_b80 = local_b90;
        local_b78 = local_b88;
        anon_unknown_137::make_mf_crse_mask<amrex::iMultiFab,_0>
                  (in_stack_ffffffffffffe828,iVar17,IVar20,ratio_00);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        anon_unknown_137::mf_set_domain_bndry<amrex::MultiFab,_0>
                  ((MultiFab *)in_stack_ffffffffffffe6d0,in_stack_00000080);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                  (in_stack_ffffffffffffe728,(Real)in_stack_ffffffffffffe720,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_ffffffffffffe71c,in_stack_ffffffffffffe718),
                   (Vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
                   (int)((ulong)in_stack_ffffffffffffe708 >> 0x20),(int)in_stack_ffffffffffffe708,
                   (int)((ulong)in_stack_ffffffffffffe700 >> 0x20),in_stack_ffffffffffffe740,
                   (StateDataPhysBCFunct *)in_stack_ffffffffffffe748,(int)in_stack_ffffffffffffe750)
        ;
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        anon_unknown_137::mf_set_domain_bndry<amrex::MultiFab,_0>
                  ((MultiFab *)in_stack_00000030,(Geometry *)in_stack_00000020);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                  (in_stack_ffffffffffffe728,(Real)in_stack_ffffffffffffe720,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_ffffffffffffe71c,in_stack_ffffffffffffe718),
                   (Vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
                   (int)((ulong)in_stack_ffffffffffffe708 >> 0x20),(int)in_stack_ffffffffffffe708,
                   (int)((ulong)in_stack_ffffffffffffe700 >> 0x20),in_stack_ffffffffffffe740,
                   (StateDataPhysBCFunct *)in_stack_ffffffffffffe748,(int)in_stack_ffffffffffffe750)
        ;
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                             in_stack_00000040,(size_type)in_stack_00000028);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        FabArrayBase::boxArray((FabArrayBase *)*ppMVar5);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        amrex::coarsen(in_stack_ffffffffffffe6e8,(IntVect *)in_stack_ffffffffffffe6e0);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                             in_stack_00000040,(size_type)in_stack_00000028);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar5);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_da8[0].tags.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_da8[0].tags.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_da8[0].alloc = false;
        local_da8[0]._1_7_ = 0;
        local_da8[0].arena = (Arena *)0x0;
        local_da8[0].tags.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        MFInfo::MFInfo((MFInfo *)0x13a0d94);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MFInfo::SetAlloc(local_da8,false);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_00000040);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MultiFab::MultiFab((MultiFab *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710)
                           ,(BoxArray *)in_stack_ffffffffffffe708,
                           (DistributionMapping *)in_stack_ffffffffffffe700,
                           (int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                           (IntVect *)in_stack_ffffffffffffe6f0,(MFInfo *)in_stack_ffffffffffffe6e8,
                           (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe720);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)0x13a0e22);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MFInfo::~MFInfo((MFInfo *)0x13a0e2f);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        BoxArray::~BoxArray((BoxArray *)in_stack_00000040);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        FabArrayBase::boxArray(&local_9d0);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        amrex::coarsen(in_stack_ffffffffffffe6e8,(IntVect *)in_stack_ffffffffffffe6e0);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        FabArrayBase::DistributionMap(&local_9d0);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_fc8[0].tags.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_fc8[0].tags.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_fc8[0].alloc = false;
        local_fc8[0]._1_7_ = 0;
        local_fc8[0].arena = (Arena *)0x0;
        local_fc8[0].tags.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        MFInfo::MFInfo((MFInfo *)0x13a0eba);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MFInfo::SetAlloc(local_fc8,false);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_fd0 = 0;
        puVar12 = &local_fd0;
        DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_00000040);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MultiFab::MultiFab((MultiFab *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710)
                           ,(BoxArray *)in_stack_ffffffffffffe708,
                           (DistributionMapping *)in_stack_ffffffffffffe700,
                           (int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),
                           (int)in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f0,
                           (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe720);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)0x13a0f4a);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MFInfo::~MFInfo((MFInfo *)0x13a0f57);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        BoxArray::~BoxArray((BoxArray *)in_stack_00000040);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        IntVect::IntVect(&local_a4,0);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_b0 = local_a4.vect[2];
        local_b8[0] = local_a4.vect[0];
        local_b8[1] = local_a4.vect[1];
        local_1128 = local_a4.vect[2];
        local_1130[0] = local_a4.vect[0];
        local_1130[1] = local_a4.vect[1];
        local_1118 = local_a4.vect[2];
        local_1120[0] = local_a4.vect[0];
        local_1120[1] = local_a4.vect[1];
        IntVect::IntVect(&local_c4,0);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_d0 = local_c4.vect[2];
        local_d8[0] = local_c4.vect[0];
        local_d8[1] = local_c4.vect[1];
        local_1148 = local_c4.vect[2];
        local_1150[0] = local_c4.vect[0];
        local_1150[1] = local_c4.vect[1];
        local_1138 = local_c4.vect[2];
        local_1140[0] = local_c4.vect[0];
        local_1140[1] = local_c4.vect[1];
        PVar11 = Geometry::periodicity(in_stack_ffffffffffffe700);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        local_1170.vect[2] = PVar11.period.vect[2];
        local_1158 = local_1170.vect[2];
        local_1170.vect._0_8_ = PVar11.period.vect._0_8_;
        local_1160._0_4_ = local_1170.vect[0];
        local_1160._4_4_ = local_1170.vect[1];
        mfi_00 = (MFIter *)((ulong)puVar12 & 0xffffffff00000000);
        local_1170 = PVar11.period.vect;
        FabArrayBase::CPC::CPC
                  (in_stack_ffffffffffffe760,in_stack_ffffffffffffe758,in_stack_ffffffffffffe750,
                   (FabArrayBase *)in_stack_ffffffffffffe748,(IntVect *)in_stack_ffffffffffffe740,
                   (Periodicity *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738),
                   SUB81((ulong)in_stack_ffffffffffffe730 >> 0x38,0));
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
                  ((FabArray<amrex::IArrayBox> *)in_stack_00000040,
                   (value_type)((ulong)mfi_00 >> 0x20));
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
                  (in_stack_ffffffffffffe720,in_stack_ffffffffffffe71c,
                   (CommMetaData *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
                   (int)((ulong)in_stack_ffffffffffffe708 >> 0x20),(int)in_stack_ffffffffffffe708);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MFIter::MFIter((MFIter *)in_stack_ffffffffffffe700,in_stack_ffffffffffffe6f8,
                       (uchar)((ulong)in_stack_ffffffffffffe6f0 >> 0x38));
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        while( true ) {
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar15 = local_1634._4_4_;
          uVar4 = uStack_163c._4_4_;
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          bVar3 = MFIter::isValid(&local_11d0);
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          gpu_or_cpu = (RunOn)in_stack_ffffffffffffe798;
          iVar17 = (int)in_stack_ffffffffffffe790;
          if (!bVar3) break;
          pBVar7 = &FabArray<amrex::FArrayBox>::operator[](in_stack_00000040,mfi_00)->
                    super_BaseFab<double>;
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          local_11d8 = pBVar7;
          pBVar8 = BaseFab<double>::box(pBVar7);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          NullInterpHook<amrex::FArrayBox>::operator()
                    (in_stack_00000070,(FArrayBox *)pBVar7,pBVar8,0,in_stack_00000018);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          MFIter::operator++(&local_11d0);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
        }
        MFIter::~MFIter((MFIter *)in_stack_00000040);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        pFVar14 = &local_b70;
        snghost = (IntVect *)((ulong)in_stack_ffffffffffffe6f0 & 0xffffffff00000000);
        InterpFace<amrex::MultiFab,amrex::iMultiFab>
                  ((InterpBase *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738),
                   in_stack_ffffffffffffe730,(int)((ulong)in_stack_ffffffffffffe728 >> 0x20),
                   (MultiFab *)in_stack_ffffffffffffe720,in_stack_ffffffffffffe71c,
                   in_stack_ffffffffffffe718,(IntVect *)in_stack_ffffffffffffe770,
                   (iMultiFab *)CONCAT44(in_stack_ffffffffffffe77c,in_stack_ffffffffffffe778),
                   (Geometry *)CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   in_stack_ffffffffffffe788,iVar17,gpu_or_cpu,
                   (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MFIter::MFIter((MFIter *)in_stack_ffffffffffffe700,in_stack_00000060,
                       (uchar)((ulong)snghost >> 0x38));
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        while (local_1634 = uVar2, uStack_163c = uVar1, uVar15 = local_1634._4_4_,
              uVar4 = uStack_163c._4_4_, uVar1 = uStack_163c, uStack_163c._4_4_ = uVar4,
              uVar2 = local_1634, local_1634._4_4_ = uVar15, bVar3 = MFIter::isValid(&local_1238),
              uVar2 = local_1634, uVar1 = uStack_163c, bVar3) {
          pBVar7 = &FabArray<amrex::FArrayBox>::operator[](pFVar14,in_stack_00000050)->
                    super_BaseFab<double>;
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          local_1240 = pBVar7;
          pBVar8 = BaseFab<double>::box(pBVar7);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          NullInterpHook<amrex::FArrayBox>::operator()
                    (in_stack_00000078,(FArrayBox *)pBVar7,pBVar8,0,in_stack_00000018);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          MFIter::operator++(&local_1238);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
        }
        MFIter::~MFIter((MFIter *)pFVar14);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar15 = local_1634._4_4_;
        uVar4 = uStack_163c._4_4_;
        local_1241 = 0;
        local_1250 = local_1d0;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        local_1258._M_current =
             (MultiFab **)
             std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
                       ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                        in_stack_00000050);
        uVar15 = local_1634._4_4_;
        uVar4 = uStack_163c._4_4_;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        local_1260 = (MultiFab **)
                     std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::end
                               ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                                in_stack_00000050);
        uVar15 = local_1634._4_4_;
        uVar4 = uStack_163c._4_4_;
        while( true ) {
          local_1634._4_4_ = uVar15;
          uStack_163c._4_4_ = uVar4;
          uVar15 = local_1634._4_4_;
          uVar4 = uStack_163c._4_4_;
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                              *)pFVar14,
                             (__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                              *)in_stack_00000050);
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          CVar18 = (CpOp)in_stack_ffffffffffffe740;
          iVar17 = (int)((ulong)in_stack_00000060 >> 0x20);
          if (!bVar3) break;
          local_1268 = __gnu_cxx::
                       __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                       ::operator*(&local_1258);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar15 = local_1634._4_4_;
          uVar4 = uStack_163c._4_4_;
          bVar9 = local_1241 & 1;
          local_1241 = true;
          if (bVar9 == 0) {
            local_1241 = local_1a8 == &(*local_1268)->super_FabArray<amrex::FArrayBox>;
          }
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          __gnu_cxx::
          __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
          ::operator++(&local_1258);
          uVar15 = local_1634._4_4_;
          uVar4 = uStack_163c._4_4_;
        }
        if ((local_1241 & 1) == 0) {
          IntVect::IntVect(&local_1280,0);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          this = (CPC *)Periodicity::NonPeriodic();
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          FabArray<amrex::FArrayBox>::ParallelCopy
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
                     in_stack_ffffffffffffe708,(int)((ulong)in_stack_ffffffffffffe700 >> 0x20),
                     (int)in_stack_ffffffffffffe700,iVar17,snghost,
                     (IntVect *)in_stack_ffffffffffffe730,
                     (Periodicity *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738),
                     CVar18,(CPC *)in_stack_ffffffffffffe748);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
        }
        else {
          IntVect::IntVect(&local_1274,0);
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar15 = local_1634._4_4_;
          uVar4 = uStack_163c._4_4_;
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          this = (CPC *)Periodicity::NonPeriodic();
          uVar15 = local_1634._4_4_;
          uVar4 = uStack_163c._4_4_;
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          FabArray<amrex::FArrayBox>::ParallelCopyToGhost
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
                     in_stack_ffffffffffffe708,(int)((ulong)in_stack_ffffffffffffe700 >> 0x20),
                     (int)in_stack_ffffffffffffe700,iVar17,snghost,
                     (IntVect *)in_stack_ffffffffffffe720,(Periodicity *)in_stack_ffffffffffffe728);
          uVar15 = local_1634._4_4_;
          uVar4 = uStack_163c._4_4_;
          uVar1 = uStack_163c;
          uVar2 = local_1634;
          uStack_163c._4_4_ = uVar4;
          local_1634._4_4_ = uVar15;
        }
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar15 = local_1634._4_4_;
        uVar4 = uStack_163c._4_4_;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        FabArrayBase::CPC::~CPC(this);
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MultiFab::~MultiFab((MultiFab *)0x13a1748);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MultiFab::~MultiFab((MultiFab *)0x13a1755);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        iMultiFab::~iMultiFab((iMultiFab *)0x13a1762);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MultiFab::~MultiFab((MultiFab *)0x13a176f);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        MultiFab::~MultiFab((MultiFab *)0x13a177c);
        local_1634 = uVar2;
        uStack_163c = uVar1;
        uVar2 = local_1634;
        uVar1 = uStack_163c;
      }
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar15 = local_1634._4_4_;
      uVar4 = uStack_163c._4_4_;
      uVar1 = uStack_163c;
      uStack_163c._4_4_ = uVar4;
      uVar2 = local_1634;
      local_1634._4_4_ = uVar15;
      MultiFab::~MultiFab((MultiFab *)0x13a17db);
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      MultiFab::~MultiFab((MultiFab *)0x13a17e8);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
    }
    else {
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_ffffffffffffe6d0,(size_type)in_stack_ffffffffffffe6c8);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      flags_ = (uchar)((ulong)in_stack_ffffffffffffe6f0 >> 0x38);
      iVar17 = (int)in_stack_ffffffffffffe750;
      FabArrayBase::TheFPinfo
                (in_stack_ffffffffffffe878,
                 (FabArrayBase *)CONCAT44(in_stack_ffffffffffffe874,in_stack_ffffffffffffe870),
                 in_stack_ffffffffffffe868,
                 (BoxConverter *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
                 in_stack_ffffffffffffe858,
                 (Geometry *)CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
                 (IndexSpace *)in_stack_ffffffffffffe9a0);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      bVar3 = BoxArray::empty((BoxArray *)0x13a1882);
      local_1634 = uVar2;
      uStack_163c = uVar1;
      uVar2 = local_1634;
      uVar1 = uStack_163c;
      if (!bVar3) {
        anon_unknown_137::make_mf_crse_patch<amrex::MultiFab,_0>
                  (in_stack_ffffffffffffe748,(int)((ulong)in_stack_ffffffffffffe740 >> 0x20));
        anon_unknown_137::mf_set_domain_bndry<amrex::MultiFab,_0>
                  ((MultiFab *)in_stack_ffffffffffffe6d0,in_stack_00000080);
        pFVar13 = in_stack_00000020;
        FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                  (in_stack_ffffffffffffe728,(Real)in_stack_ffffffffffffe720,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_ffffffffffffe71c,in_stack_ffffffffffffe718),
                   (Vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
                   (int)((ulong)in_stack_ffffffffffffe708 >> 0x20),(int)in_stack_ffffffffffffe708,
                   (int)((ulong)in_stack_ffffffffffffe700 >> 0x20),in_stack_ffffffffffffe740,
                   (StateDataPhysBCFunct *)in_stack_ffffffffffffe748,iVar17);
        anon_unknown_137::make_mf_fine_patch<amrex::MultiFab,_0>
                  (in_stack_ffffffffffffe748,(int)((ulong)in_stack_ffffffffffffe740 >> 0x20));
        MFIter::MFIter((MFIter *)in_stack_ffffffffffffe700,in_stack_ffffffffffffe6f8,flags_);
        while( true ) {
          bVar3 = MFIter::isValid(local_15e8);
          uVar15 = (undefined4)((ulong)in_stack_ffffffffffffe6f8 >> 0x20);
          if (!bVar3) break;
          auStack_1620._48_8_ =
               FabArray<amrex::FArrayBox>::operator[](in_stack_00000030,(MFIter *)pFVar13);
          auStack_1620._40_8_ = BaseFab<double>::box((BaseFab<double> *)auStack_1620._48_8_);
          NullInterpHook<amrex::FArrayBox>::operator()
                    (in_stack_00000070,(FArrayBox *)auStack_1620._48_8_,(Box *)auStack_1620._40_8_,0
                     ,in_stack_00000018);
          MFIter::operator++(local_15e8);
        }
        MFIter::~MFIter((MFIter *)in_stack_00000030);
        iVar17 = in_stack_00000018;
        IntVect::IntVect((IntVect *)(auStack_1620 + 0x1c),0);
        pBVar8 = Geometry::Domain((Geometry *)in_stack_00000028);
        local_1648 = (uint)FabArrayBase::ixType(pFVar13);
        local_190 = &local_1648;
        local_1644 = *(int (*) [2])(pBVar8->smallend).vect;
        uVar1 = *(undefined8 *)((pBVar8->smallend).vect + 2);
        uStack_163c._0_4_ = SUB84(uVar1,0);
        uStack_163c._4_4_ = (uint)((ulong)uVar1 >> 0x20);
        uVar2 = *(undefined8 *)((pBVar8->bigend).vect + 1);
        local_1634._0_4_ = (int)uVar2;
        local_1634._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
        local_162c._0_4_ = (pBVar8->btype).itype;
        local_170 = local_1644;
        for (local_174 = 0; local_174 < 3; local_174 = local_174 + 1) {
          local_150 = &local_168;
          local_154 = local_174;
          local_144 = local_174;
          local_124 = local_174;
          bVar9 = (byte)local_174;
          local_178 = (uint)((local_1648 & 1 << (bVar9 & 0x1f)) != 0);
          local_160 = local_162c;
          local_164 = local_174;
          local_134 = local_174;
          local_128 = local_174;
          local_17c = (uint)((local_162c._0_4_ & 1 << (bVar9 & 0x1f)) != 0);
          local_180 = local_178 - local_17c;
          local_118 = (long)&uStack_163c + 4;
          local_11c = local_174;
          *(int *)(local_118 + (long)local_174 * 4) =
               local_180 + *(int *)(local_118 + (long)local_174 * 4);
          in_stack_ffffffffffffe730 = (MultiFab *)local_162c;
          local_10c = local_174;
          if (local_178 == 0) {
            local_fc = local_174;
            local_f0 = local_174;
            local_162c._0_4_ = (1 << (bVar9 & 0x1f) ^ 0xffffffffU) & local_162c._0_4_;
            local_f8 = in_stack_ffffffffffffe730;
          }
          else {
            local_ec = local_174;
            local_dc = local_174;
            local_162c._0_4_ = 1 << (bVar9 & 0x1f) | local_162c._0_4_;
            local_e8 = in_stack_ffffffffffffe730;
          }
          local_140 = local_150;
          local_130 = local_160;
          local_120 = local_180;
          local_110 = local_178;
          local_108 = in_stack_ffffffffffffe730;
        }
        local_10 = local_1644;
        local_18 = local_1b0;
        auStack_1620._12_8_ = CONCAT44(local_162c._0_4_,local_1634._4_4_);
        auStack_1620._8_4_ = (int)local_1634;
        auStack_1620._0_4_ = uStack_163c._0_4_;
        auStack_1620._4_4_ = uStack_163c._4_4_;
        this_00 = (Box *)(local_162c + 4);
        IVar20.itype = uStack_163c._4_4_;
        uStack_163c = uVar1;
        uVar16 = local_1634._4_4_;
        local_1634 = uVar2;
        local_162c._4_8_ = local_1644;
        local_194 = local_1648;
        local_188 = pBVar8;
        local_168 = local_1648;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = IVar20.itype;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar16;
        Box::grow(this_00,local_1b0);
        uVar16 = local_1634._4_4_;
        uVar4 = uStack_163c._4_4_;
        fabarray_ = (FabArrayBase *)CONCAT44(uVar15,in_stack_00000068);
        pFVar13 = in_stack_00000020;
        pFVar14 = in_stack_00000028;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar16;
        FillPatchInterp<amrex::MultiFab>
                  ((MultiFab *)CONCAT44(iVar17,in_stack_ffffffffffffe738),
                   (int)((ulong)in_stack_ffffffffffffe730 >> 0x20),(MultiFab *)this_00,
                   (int)((ulong)in_stack_ffffffffffffe720 >> 0x20),(int)in_stack_ffffffffffffe720,
                   (IntVect *)CONCAT44(in_stack_ffffffffffffe71c,in_stack_ffffffffffffe718),
                   in_stack_ffffffffffffe770,
                   (Geometry *)CONCAT44(in_stack_ffffffffffffe77c,in_stack_ffffffffffffe778),
                   (Box *)CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (IntVect *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe790,
                   in_stack_ffffffffffffe798,in_stack_ffffffffffffe7a0);
        uVar15 = local_1634._4_4_;
        uVar4 = uStack_163c._4_4_;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        MFIter::MFIter((MFIter *)in_stack_ffffffffffffe700,fabarray_,
                       (uchar)((ulong)in_stack_00000060 >> 0x38));
        uVar15 = local_1634._4_4_;
        uVar4 = uStack_163c._4_4_;
        uVar1 = uStack_163c;
        uVar2 = local_1634;
        uStack_163c._4_4_ = uVar4;
        local_1634._4_4_ = uVar15;
        while( true ) {
          local_1634 = uVar2;
          uStack_163c = uVar1;
          uVar15 = local_1634._4_4_;
          uVar4 = uStack_163c._4_4_;
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          bVar3 = MFIter::isValid((MFIter *)&stack0xffffffffffffe958);
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          CVar18 = (CpOp)pFVar13;
          iVar19 = (int)((ulong)fabarray_ >> 0x20);
          uStack_163c = uVar1;
          local_1634 = uVar2;
          if (!bVar3) break;
          uVar4 = uStack_163c._4_4_;
          uVar15 = local_1634._4_4_;
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          local_16b0 = &FabArray<amrex::FArrayBox>::operator[]
                                  (in_stack_00000028,(MFIter *)in_stack_00000020)->
                        super_BaseFab<double>;
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          uVar4 = uStack_163c._4_4_;
          uStack_163c = uVar1;
          uVar15 = local_1634._4_4_;
          local_1634 = uVar2;
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          local_16b8 = BaseFab<double>::box(local_16b0);
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          uVar4 = uStack_163c._4_4_;
          uStack_163c = uVar1;
          uVar15 = local_1634._4_4_;
          local_1634 = uVar2;
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          NullInterpHook<amrex::FArrayBox>::operator()
                    (in_stack_00000078,(FArrayBox *)local_16b0,local_16b8,0,in_stack_00000018);
          uVar2 = local_1634;
          uVar1 = uStack_163c;
          uVar4 = uStack_163c._4_4_;
          uStack_163c = uVar1;
          uVar15 = local_1634._4_4_;
          local_1634 = uVar2;
          uVar1 = uStack_163c;
          uStack_163c._4_4_ = uVar4;
          uVar2 = local_1634;
          local_1634._4_4_ = uVar15;
          MFIter::operator++((MFIter *)&stack0xffffffffffffe958);
          uVar2 = local_1634;
          uVar1 = uStack_163c;
        }
        uVar4 = uStack_163c._4_4_;
        uVar15 = local_1634._4_4_;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        MFIter::~MFIter((MFIter *)in_stack_00000028);
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        uVar16 = 0;
        uVar4 = uStack_163c._4_4_;
        uStack_163c = uVar1;
        uVar15 = local_1634._4_4_;
        local_1634 = uVar2;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        IntVect::IntVect(&local_16c4,0);
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        uVar4 = uStack_163c._4_4_;
        uStack_163c = uVar1;
        uVar15 = local_1634._4_4_;
        local_1634 = uVar2;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        Periodicity::NonPeriodic();
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        uVar4 = uStack_163c._4_4_;
        uStack_163c = uVar1;
        uVar15 = local_1634._4_4_;
        local_1634 = uVar2;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        FabArray<amrex::FArrayBox>::ParallelCopy
                  ((FabArray<amrex::FArrayBox> *)CONCAT44(uVar16,in_stack_ffffffffffffe710),
                   local_1a8,(int)((ulong)local_1b0 >> 0x20),(int)local_1b0,iVar19,
                   (IntVect *)in_stack_00000060,(IntVect *)in_stack_ffffffffffffe730,
                   (Periodicity *)CONCAT44(iVar17,in_stack_ffffffffffffe738),CVar18,(CPC *)pFVar14);
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        uVar4 = uStack_163c._4_4_;
        uStack_163c = uVar1;
        uVar15 = local_1634._4_4_;
        local_1634 = uVar2;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        MultiFab::~MultiFab((MultiFab *)0x13a1fce);
        uVar2 = local_1634;
        uVar1 = uStack_163c;
        uVar4 = uStack_163c._4_4_;
        uStack_163c = uVar1;
        uVar15 = local_1634._4_4_;
        local_1634 = uVar2;
        uVar1 = uStack_163c;
        uStack_163c._4_4_ = uVar4;
        uVar2 = local_1634;
        local_1634._4_4_ = uVar15;
        MultiFab::~MultiFab((MultiFab *)0x13a1fdb);
        uVar2 = local_1634;
        uVar1 = uStack_163c;
      }
    }
    local_1634 = uVar2;
    uStack_163c = uVar1;
    uVar15 = local_1634._4_4_;
    uVar4 = uStack_163c._4_4_;
    uVar1 = uStack_163c;
    uStack_163c._4_4_ = uVar4;
    uVar2 = local_1634;
    local_1634._4_4_ = uVar15;
    InterpolaterBoxCoarsener::~InterpolaterBoxCoarsener((InterpolaterBoxCoarsener *)0x13a2008);
    uVar2 = local_1634;
    uVar1 = uStack_163c;
    uVar4 = uStack_163c._4_4_;
    uVar15 = local_1634._4_4_;
  }
  local_1634._4_4_ = uVar15;
  uStack_163c._4_4_ = uVar4;
  local_1634 = uVar2;
  uStack_163c = uVar1;
  uVar15 = local_1634._4_4_;
  uVar4 = uStack_163c._4_4_;
  uVar1 = uStack_163c;
  uStack_163c._4_4_ = uVar4;
  uVar2 = local_1634;
  local_1634._4_4_ = uVar15;
  FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
            (in_stack_ffffffffffffed40,in_stack_ffffffffffffed38,in_stack_ffffffffffffed30,
             in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c,
             in_stack_ffffffffffffed18,in_stack_fffffffffffff120,in_stack_fffffffffffff128,
             in_stack_fffffffffffff130,in_stack_fffffffffffff138);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
    FillPatchTwoLevels_doit (MF& mf, IntVect const& nghost, Real time,
                             const Vector<MF*>& cmf, const Vector<Real>& ct,
                             const Vector<MF*>& fmf, const Vector<Real>& ft,
                             int scomp, int dcomp, int ncomp,
                             const Geometry& cgeom, const Geometry& fgeom,
                             BC& cbc, int cbccomp,
                             BC& fbc, int fbccomp,
                             const IntVect& ratio,
                             Interp* mapper,
                             const Vector<BCRec>& bcs, int bcscomp,
                             const PreInterpHook& pre_interp,
                             const PostInterpHook& post_interp,
                             EB2::IndexSpace const* index_space)
    {
        BL_PROFILE("FillPatchTwoLevels");

        if (nghost.max() > 0 || mf.getBDKey() != fmf[0]->getBDKey())
        {
            const InterpolaterBoxCoarsener& coarsener = mapper->BoxCoarsener(ratio);

            // Test for Face-centered data
            if ( AMREX_D_TERM(  mf.ixType().nodeCentered(0),
                              + mf.ixType().nodeCentered(1),
                              + mf.ixType().nodeCentered(2) ) == 1 )
            {
                if ( !dynamic_cast<Interpolater*>(mapper) ){
                    amrex::Abort("This interpolater has not yet implemented a version for face-based data");
                }

                // Convert to cell-centered MF meta-data for FPInfo.
                MF mf_cc_dummy( amrex::convert(mf.boxArray(), IntVect::TheZeroVector()),
                                mf.DistributionMap(), ncomp, nghost, MFInfo().SetAlloc(false) );
                MF fmf_cc_dummy( amrex::convert(fmf[0]->boxArray(), IntVect::TheZeroVector()),
                                 fmf[0]->DistributionMap(), ncomp, nghost, MFInfo().SetAlloc(false) );

                const FabArrayBase::FPinfo& fpc = FabArrayBase::TheFPinfo(fmf_cc_dummy, mf_cc_dummy,
                                                                          nghost,
                                                                          coarsener,
                                                                          fgeom,
                                                                          cgeom,
                                                                          index_space);

                if ( ! fpc.ba_crse_patch.empty())
                {

                    using FAB = typename MF::FABType::value_type;

                    MF mf_crse_patch     = make_mf_crse_patch<MF>      (fpc, ncomp, mf.boxArray().ixType());
                    // Must make sure fine exists under needed coarse faces.
                    // It stores values for the final (interior) interpolation,
                    // which is done from this fine MF that's been partially filled
                    // (with only faces overlying coarse having valid data).
                    MF mf_refined_patch  = make_mf_refined_patch<MF>   (fpc, ncomp, mf.boxArray().ixType(), ratio);
                    iMultiFab solve_mask = make_mf_crse_mask<iMultiFab>(fpc, ncomp, mf.boxArray().ixType(), ratio);

                    mf_set_domain_bndry(mf_crse_patch, cgeom);
                    FillPatchSingleLevel(mf_crse_patch, time, cmf, ct, scomp, 0, ncomp,
                                         cgeom, cbc, cbccomp);

                    mf_set_domain_bndry(mf_refined_patch, fgeom);
                    FillPatchSingleLevel(mf_refined_patch, time, fmf, ft, scomp, 0, ncomp,
                                         fgeom, fbc, fbccomp);

                    // Aliased MFs, used to allow CPC caching.
                    MF mf_known( amrex::coarsen(fmf[0]->boxArray(), ratio), fmf[0]->DistributionMap(),
                                 ncomp, nghost, MFInfo().SetAlloc(false) );
                    MF mf_solution( amrex::coarsen(mf_refined_patch.boxArray(), ratio), mf_refined_patch.DistributionMap(),
                                    ncomp, 0, MFInfo().SetAlloc(false) );

                    const FabArrayBase::CPC mask_cpc( mf_solution, IntVect::TheZeroVector(),
                                                      mf_known, IntVect::TheZeroVector(),
                                                      fgeom.periodicity());

                    solve_mask.setVal(1);                   // Values to solve.
                    solve_mask.setVal(0, mask_cpc, 0, 1);   // Known values.

                    for (MFIter mfi(mf_refined_patch); mfi.isValid(); ++mfi)
                    {
                        FAB& sfab = mf_crse_patch[mfi];
                        pre_interp(sfab, sfab.box(), 0, ncomp);
                    }

                    InterpFace(mapper, mf_crse_patch, 0, mf_refined_patch, 0, ncomp,
                               ratio, solve_mask, cgeom, fgeom, bcscomp, RunOn::Gpu, bcs);

                    for (MFIter mfi(mf_refined_patch); mfi.isValid(); ++mfi)
                    {
                        FAB& dfab = mf_refined_patch[mfi];
                        post_interp(dfab, dfab.box(), 0, ncomp);
                    }

                    bool aliasing = false;
                    for (auto const& fmf_a : fmf) {
                        aliasing = aliasing || (&mf == fmf_a);
                    }
                    if (aliasing) {
                        mf.ParallelCopyToGhost(mf_refined_patch, 0, dcomp, ncomp,
                                               IntVect{0}, nghost);
                    } else {
                        mf.ParallelCopy(mf_refined_patch, 0, dcomp, ncomp,
                                        IntVect{0}, nghost);
                    }
                }
            }
            else
            {
                const FabArrayBase::FPinfo& fpc = FabArrayBase::TheFPinfo(*fmf[0], mf,
                                                                          nghost,
                                                                          coarsener,
                                                                          fgeom,
                                                                          cgeom,
                                                                          index_space);

                if ( ! fpc.ba_crse_patch.empty())
                {

                    MF mf_crse_patch = make_mf_crse_patch<MF>(fpc, ncomp);
                    mf_set_domain_bndry (mf_crse_patch, cgeom);

                    FillPatchSingleLevel(mf_crse_patch, time, cmf, ct, scomp, 0, ncomp, cgeom, cbc, cbccomp);

                    MF mf_fine_patch = make_mf_fine_patch<MF>(fpc, ncomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                    for (MFIter mfi(mf_crse_patch); mfi.isValid(); ++mfi)
                    {
                        auto& sfab = mf_crse_patch[mfi];
                        const Box& sbx = sfab.box();
                        pre_interp(sfab, sbx, 0, ncomp);
                    }

                    FillPatchInterp(mf_fine_patch, 0, mf_crse_patch, 0,
                                    ncomp, IntVect(0), cgeom, fgeom,
                                    amrex::grow(amrex::convert(fgeom.Domain(),mf.ixType()),nghost),
                                    ratio, mapper, bcs, bcscomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                    for (MFIter mfi(mf_fine_patch); mfi.isValid(); ++mfi)
                    {
                        auto& dfab = mf_fine_patch[mfi];
                        const Box& dbx = dfab.box();
                        post_interp(dfab, dbx, 0, ncomp);
                    }

                    mf.ParallelCopy(mf_fine_patch, 0, dcomp, ncomp, IntVect{0}, nghost);
                }
            }
        }

        FillPatchSingleLevel(mf, nghost, time, fmf, ft, scomp, dcomp, ncomp,
                             fgeom, fbc, fbccomp);
    }